

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error FT_Remove_Module(FT_Library library,FT_Module module)

{
  FT_Memory pFVar1;
  FT_Module_Class *pFVar2;
  FT_Library pFVar3;
  FT_Memory pFVar4;
  FT_ListNode pFVar5;
  FT_ListNode pFVar6;
  FT_Library pFVar7;
  FT_ListNode pFVar8;
  FT_Module_Class *pFVar9;
  FT_Renderer_conflict pFVar10;
  FT_Module *ppFVar11;
  FT_ListRec *pFVar12;
  FT_ListNode pFVar13;
  FT_Renderer_conflict render;
  ulong uVar14;
  
  if (library == (FT_Library)0x0) {
    return 0x21;
  }
  if (module != (FT_Module)0x0) {
    uVar14 = (ulong)library->num_modules;
    if (uVar14 != 0) {
      ppFVar11 = library->modules;
      while (*ppFVar11 != module) {
        ppFVar11 = ppFVar11 + 1;
        if (library->modules + uVar14 <= ppFVar11) {
          return 0x22;
        }
      }
      library->num_modules = library->num_modules - 1;
      for (; ppFVar11 < library->modules + (uVar14 - 1); ppFVar11 = ppFVar11 + 1) {
        *ppFVar11 = ppFVar11[1];
      }
      library->modules[uVar14 - 1] = (FT_Module)0x0;
      pFVar1 = module->memory;
      pFVar2 = module->clazz;
      pFVar3 = module->library;
      pFVar9 = pFVar2;
      if (pFVar3 != (FT_Library)0x0) {
        if (pFVar3->auto_hinter == module) {
          pFVar3->auto_hinter = (FT_Module)0x0;
        }
        if (((pFVar2->module_flags & 2) != 0) &&
           (pFVar8 = (pFVar3->renderers).head, pFVar8 != (FT_ListNode)0x0)) {
          pFVar4 = pFVar3->memory;
          do {
            if ((FT_Module)pFVar8->data == module) {
              if (((int)module[1].clazz[1].module_flags == 0x6f75746c) &&
                 (module[4].library != (FT_Library)0x0)) {
                (**(code **)((long)module[1].clazz[1].module_interface + 0x28))();
              }
              pFVar5 = pFVar8->prev;
              pFVar6 = pFVar8->next;
              pFVar12 = (FT_ListRec *)&pFVar5->next;
              if (pFVar5 == (FT_ListNode)0x0) {
                pFVar12 = &pFVar3->renderers;
              }
              pFVar12->head = pFVar6;
              pFVar13 = (FT_ListNode)&(pFVar3->renderers).tail;
              if (pFVar6 != (FT_ListNode)0x0) {
                pFVar13 = pFVar6;
              }
              pFVar13->prev = pFVar5;
              (*pFVar4->free)(pFVar4,pFVar8);
              pFVar8 = (pFVar3->renderers).head;
              goto LAB_00135d8d;
            }
            pFVar8 = pFVar8->next;
          } while (pFVar8 != (FT_ListNode)0x0);
        }
      }
      goto LAB_00135db1;
    }
  }
  return 0x22;
LAB_00135d8d:
  if (pFVar8 == (FT_ListNode)0x0) goto LAB_00135da5;
  pFVar10 = (FT_Renderer_conflict)pFVar8->data;
  if (pFVar10->glyph_format == FT_GLYPH_FORMAT_OUTLINE) goto LAB_00135da7;
  pFVar8 = pFVar8->next;
  goto LAB_00135d8d;
LAB_00135da5:
  pFVar10 = (FT_Renderer_conflict)0x0;
LAB_00135da7:
  pFVar3->cur_renderer = pFVar10;
  pFVar9 = module->clazz;
LAB_00135db1:
  if (((pFVar9->module_flags & 1) != 0) && (pFVar4 = module->memory, pFVar4 != (FT_Memory)0x0)) {
    pFVar3 = module[1].library;
    while (pFVar3 != (FT_Library)0x0) {
      pFVar7 = *(FT_Library *)&pFVar3->version_major;
      destroy_face(pFVar4,*(FT_Face *)&pFVar3->version_patch,(FT_Driver)module);
      (*pFVar4->free)(pFVar4,pFVar3);
      pFVar3 = pFVar7;
    }
    module[1].library = (FT_Library)0x0;
    module[1].memory = (FT_Memory)0x0;
  }
  if (pFVar2->module_done != (FT_Module_Destructor)0x0) {
    (*pFVar2->module_done)(module);
  }
  (*pFVar1->free)(pFVar1,module);
  return 0;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Remove_Module( FT_Library  library,
                    FT_Module   module )
  {
    /* try to find the module from the table, then remove it from there */

    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( module )
    {
      FT_Module*  cur   = library->modules;
      FT_Module*  limit = cur + library->num_modules;


      for ( ; cur < limit; cur++ )
      {
        if ( cur[0] == module )
        {
          /* remove it from the table */
          library->num_modules--;
          limit--;
          while ( cur < limit )
          {
            cur[0] = cur[1];
            cur++;
          }
          limit[0] = NULL;

          /* destroy the module */
          Destroy_Module( module );

          return FT_Err_Ok;
        }
      }
    }
    return FT_THROW( Invalid_Driver_Handle );
  }